

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

void __thiscall
vkt::rasterization::anon_unknown_0::BaseLineTestInstance::BaseLineTestInstance
          (BaseLineTestInstance *this,Context *context,VkPrimitiveTopology primitiveTopology,
          PrimitiveWideness wideness,VkSampleCountFlagBits sampleCount)

{
  vector<float,_std::allocator<float>_> *this_00;
  ostringstream *this_01;
  VkPhysicalDeviceProperties *pVVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  float *pfVar3;
  NotSupportedError *pNVar4;
  iterator iVar5;
  float *__args;
  float fVar6;
  undefined1 local_1a8 [384];
  
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (&this->super_BaseRenderingTestInstance,context,sampleCount,0x100);
  (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BaseLineTestInstance_00d012a0;
  this->m_iteration = 0;
  this->m_iterationCount = 3;
  this->m_primitiveTopology = primitiveTopology;
  this->m_primitiveWideness = wideness;
  this->m_allIterationsPassed = true;
  this->m_maxLineWidth = 1.0;
  this_00 = &this->m_lineWidths;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = Context::getDeviceProperties(context);
  if ((pVVar1->limits).strictLines == 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Strict rasterization is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x44c);
LAB_0079c87a:
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    pVVar2 = Context::getDeviceFeatures
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    if (pVVar2->wideLines == 0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x456);
      goto LAB_0079c87a;
    }
    pVVar1 = Context::getDeviceProperties(context);
    local_1a8._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ALIASED_LINE_WIDTH_RANGE = [",0x1c);
    std::ostream::_M_insert<double>((double)(pVVar1->limits).lineWidthRange[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    std::ostream::_M_insert<double>((double)(pVVar1->limits).lineWidthRange[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    __args = (pVVar1->limits).lineWidthRange + 1;
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    if (*__args <= 1.0) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x45e);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a8._0_4_ = 5.0;
    iVar5._M_current =
         (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pfVar3 = (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar5._M_current == pfVar3) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (this_00,iVar5,(float *)local_1a8);
      iVar5._M_current =
           (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar3 = (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 5.0;
      iVar5._M_current = iVar5._M_current + 1;
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    local_1a8._0_4_ = 0x41200000;
    if (iVar5._M_current == pfVar3) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (this_00,iVar5,(float *)local_1a8);
      iVar5._M_current =
           (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar3 = (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 10.0;
      iVar5._M_current = iVar5._M_current + 1;
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    if (iVar5._M_current == pfVar3) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)this_00,iVar5,__args);
      fVar6 = *__args;
    }
    else {
      fVar6 = *__args;
      *iVar5._M_current = fVar6;
      (this->m_lineWidths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    this->m_maxLineWidth = fVar6;
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    local_1a8._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (this_00,(long)this->m_iterationCount,(value_type_conflict2 *)local_1a8);
  }
  return;
}

Assistant:

BaseLineTestInstance::BaseLineTestInstance (Context& context, VkPrimitiveTopology primitiveTopology, PrimitiveWideness wideness, VkSampleCountFlagBits sampleCount)
	: BaseRenderingTestInstance			(context, sampleCount)
	, m_iteration						(0)
	, m_iterationCount					(3)
	, m_primitiveTopology				(primitiveTopology)
	, m_primitiveWideness				(wideness)
	, m_allIterationsPassed				(true)
	, m_maxLineWidth					(1.0f)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);

	if (!context.getDeviceProperties().limits.strictLines)
		TCU_THROW(NotSupportedError, "Strict rasterization is not supported");

	// create line widths
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_lineWidths.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		if (!m_context.getDeviceFeatures().wideLines)
			TCU_THROW(NotSupportedError , "wide line support required");

		const float*	range = context.getDeviceProperties().limits.lineWidthRange;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			TCU_THROW(NotSupportedError, "wide line support required");

		// set hand picked sizes
		m_lineWidths.push_back(5.0f);
		m_lineWidths.push_back(10.0f);
		m_lineWidths.push_back(range[1]);
		DE_ASSERT((int)m_lineWidths.size() == m_iterationCount);

		m_maxLineWidth = range[1];
	}
	else
		DE_ASSERT(false);
}